

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

StringPtr __thiscall kj::trimSourceFilename(kj *this,StringPtr filename)

{
  char *__s;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  StringPtr SVar10;
  
  pcVar4 = filename.content.ptr;
  do {
    pcVar2 = pcVar4 + -1;
    bVar7 = pcVar4 == (char *)0x1;
    if (!bVar7) {
      pcVar5 = (char *)0x0;
      do {
        if ((pcVar5 == (char *)0x0) || (bVar8 = true, (pcVar5 + -1)[(long)this] == '/')) {
          lVar6 = 0;
          do {
            __s = *(char **)((long)trimSourceFilename::ROOTS + lVar6);
            pcVar3 = (char *)strlen(__s);
            if (pcVar4 + ~(ulong)pcVar5 < pcVar3) {
              bVar8 = false;
            }
            else if (pcVar3 == (char *)0x0) {
              bVar8 = true;
            }
            else {
              iVar1 = bcmp(this + (long)pcVar5,__s,(size_t)pcVar3);
              bVar8 = iVar1 == 0;
            }
            if (bVar8) {
              pcVar3 = pcVar3 + (long)pcVar5;
            }
            else {
              pcVar3 = (char *)0x0;
            }
            this = this + (long)pcVar3;
            pcVar4 = pcVar4 + -(long)pcVar3;
          } while ((!bVar8) && (bVar9 = lVar6 != 0x18, lVar6 = lVar6 + 8, bVar9));
          bVar8 = (bool)(bVar8 ^ 1);
        }
        if (!bVar8) break;
        pcVar5 = pcVar5 + 1;
        bVar7 = pcVar5 == pcVar2;
      } while (!bVar7);
    }
    if (bVar7) {
      SVar10.content.size_ = (size_t)pcVar4;
      SVar10.content.ptr = (char *)this;
      return (StringPtr)SVar10.content;
    }
  } while( true );
}

Assistant:

kj::StringPtr trimSourceFilename(kj::StringPtr filename) {
  // Removes noisy prefixes from source code file name.
  //
  // The goal here is to produce the "canonical" filename given the filename returned by e.g.
  // addr2line. addr2line gives us the full path of the file as passed on the compiler
  // command-line, which in turn is affected by build system and by whether and where we're
  // performing an out-of-tree build.
  //
  // To deal with all this, we look for directory names in the path which we recognize to be
  // locations that represent roots of the source tree. We strip said root and everything before
  // it.
  //
  // On Windows, we often get filenames containing backslashes. Since we aren't allowed to allocate
  // a new string here, we can't do much about this, so our returned "canonical" name will
  // unfortunately end up with backslashes.

  static constexpr const char* ROOTS[] = {
    "ekam-provider/canonical/",  // Ekam source file.
    "ekam-provider/c++header/",  // Ekam include file.
    "src/",                      // Non-Ekam source root.
    "tmp/",                      // Non-Ekam generated code.
#if _WIN32
    "src\\",                     // Win32 source root.
    "tmp\\",                     // Win32 generated code.
#endif
  };

retry:
  for (size_t i: kj::indices(filename)) {
    if (i == 0 || filename[i-1] == '/'
#if _WIN32
               || filename[i-1] == '\\'
#endif
        ) {
      // We're at the start of a directory name. Check for valid prefixes.
      for (kj::StringPtr root: ROOTS) {
        if (filename.slice(i).startsWith(root)) {
          filename = filename.slice(i + root.size());

          // We should keep searching to find the last instance of a root name. `i` is no longer
          // a valid index for `filename` so start the loop over.
          goto retry;
        }
      }
    }
  }

  return filename;
}